

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O0

unsigned_long file_size(void *file,void *user_data)

{
  long __off;
  long n;
  long p;
  FILE *f;
  void *user_data_local;
  void *file_local;
  
  __off = ftell((FILE *)file);
  fseek((FILE *)file,0,2);
  file_local = (void *)ftell((FILE *)file);
  fseek((FILE *)file,__off,0);
  if ((long)file_local < 1) {
    file_local = (void *)0x0;
  }
  return (unsigned_long)file_local;
}

Assistant:

static
unsigned long file_size(void* file, void* user_data)
{
   FILE* f;
   long p;
   long n;
   (void)(user_data);
   
   f = (FILE*)(file);

   p = ftell(f);
   fseek(f, 0, SEEK_END);
   n = ftell(f);
   fseek(f, p, SEEK_SET);

   if (n > 0)
       return (unsigned long)(n);
   else
       return 0;
}